

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void open_func(LexState *ls,FuncState *fs,BlockCnt *bl)

{
  lua_State *L;
  Proto *pPVar1;
  StkId pTVar2;
  Dyndata *pDVar3;
  GCObject *pGVar4;
  
  L = ls->L;
  fs->prev = ls->fs;
  fs->ls = ls;
  ls->fs = fs;
  fs->pc = 0;
  fs->lasttarget = 0;
  fs->jpc = -1;
  fs->nk = 0;
  fs->np = 0;
  fs->nlocvars = 0;
  fs->nactvar = '\0';
  fs->nups = '\0';
  fs->freereg = '\0';
  fs->firstlocal = (ls->dyd->actvar).n;
  fs->bl = (BlockCnt *)0x0;
  pPVar1 = fs->f;
  pPVar1->source = ls->source;
  pPVar1->maxstacksize = '\x02';
  pGVar4 = (GCObject *)luaH_new(L);
  fs->h = (Table *)pGVar4;
  pTVar2 = L->top;
  (pTVar2->value_).gc = pGVar4;
  pTVar2->tt_ = 0x45;
  pTVar2 = L->top;
  L->top = pTVar2 + 1;
  if ((long)L->stack_last - (long)(pTVar2 + 1) < 0x10) {
    luaD_growstack(L,0);
  }
  bl->isloop = '\0';
  bl->nactvar = fs->nactvar;
  pDVar3 = fs->ls->dyd;
  bl->firstlabel = (short)(pDVar3->label).n;
  bl->firstgoto = (short)(pDVar3->gt).n;
  bl->upval = '\0';
  bl->previous = fs->bl;
  fs->bl = bl;
  return;
}

Assistant:

static void open_func (LexState *ls, FuncState *fs, BlockCnt *bl) {
  lua_State *L = ls->L;
  Proto *f;
  fs->prev = ls->fs;  /* linked list of funcstates */
  fs->ls = ls;
  ls->fs = fs;
  fs->pc = 0;
  fs->lasttarget = 0;
  fs->jpc = NO_JUMP;
  fs->freereg = 0;
  fs->nk = 0;
  fs->np = 0;
  fs->nups = 0;
  fs->nlocvars = 0;
  fs->nactvar = 0;
  fs->firstlocal = ls->dyd->actvar.n;
  fs->bl = NULL;
  f = fs->f;
  f->source = ls->source;
  f->maxstacksize = 2;  /* registers 0/1 are always valid */
  fs->h = luaH_new(L);
  /* anchor table of constants (to avoid being collected) */
  sethvalue2s(L, L->top, fs->h);
  incr_top(L);
  enterblock(fs, bl, 0);
}